

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

Image<double> *
eos::core::image::constant<double>
          (Image<double> *__return_storage_ptr__,int height,int width,double value)

{
  double *pdVar1;
  int x;
  int x_00;
  int y;
  
  Image<double>::Image(__return_storage_ptr__,height,width);
  y = 0;
  if (width < 1) {
    width = 0;
  }
  if (height < 1) {
    height = y;
  }
  for (; y != height; y = y + 1) {
    for (x_00 = 0; width != x_00; x_00 = x_00 + 1) {
      pdVar1 = Image<double>::operator()(__return_storage_ptr__,y,x_00);
      *pdVar1 = value;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<PixelType> constant(int height, int width, PixelType value) noexcept
{
    Image<PixelType> image(height, width);
    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            image(y, x) = value;
        }
    }
    return image;
}